

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionCube.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionCube<double,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionCube<double,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          double **transitionMatrices,int count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  double *pdVar19;
  long lVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  
  uVar8 = (this->super_EigenDecomposition<double,_1>).kStateCount;
  uVar18 = (ulong)uVar8;
  uVar23 = uVar8 + 3;
  if (-1 < (int)uVar8) {
    uVar23 = uVar8;
  }
  if (firstDerivativeIndices == (int *)0x0 && secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar25 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
      uVar21 = 0;
      uVar18 = (ulong)uVar8;
      do {
        if (0 < (int)uVar25) {
          iVar30 = 0;
          pdVar10 = transitionMatrices[probabilityIndices[uVar21]];
          lVar20 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar29 = 0;
              do {
                dVar31 = exp((this->super_EigenDecomposition<double,_1>).gEigenValues
                             [eigenIndices[lVar20]][lVar29] * edgeLengths[uVar21]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar31;
                lVar29 = lVar29 + 1;
                iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar18 = (ulong)iVar9;
              } while (lVar29 < (long)uVar18);
              if (0 < iVar9) {
                iVar26 = 0;
                pdVar19 = this->gCMatrices[eigenIndices[lVar20]];
                do {
                  pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  iVar22 = 0;
                  lVar29 = (long)iVar30;
                  do {
                    lVar24 = lVar29;
                    if ((int)uVar8 < 4) {
                      auVar34 = ZEXT1664(ZEXT816(0));
                      uVar25 = 0;
                    }
                    else {
                      auVar34 = ZEXT1664(ZEXT816(0));
                      uVar25 = 0;
                      do {
                        auVar35._8_8_ = 0;
                        auVar35._0_8_ = pdVar19[uVar25];
                        auVar39._8_8_ = 0;
                        auVar39._0_8_ = pdVar19[uVar25 + 1];
                        auVar37._8_8_ = 0;
                        auVar37._0_8_ = pdVar11[uVar25];
                        auVar37 = vfmadd132sd_fma(auVar35,auVar34._0_16_,auVar37);
                        auVar33._8_8_ = 0;
                        auVar33._0_8_ = pdVar19[uVar25 + 3];
                        auVar1._8_8_ = 0;
                        auVar1._0_8_ = pdVar11[uVar25 + 1];
                        auVar37 = vfmadd231sd_fma(auVar37,auVar39,auVar1);
                        auVar40._8_8_ = 0;
                        auVar40._0_8_ = pdVar19[uVar25 + 2];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar11[uVar25 + 2];
                        auVar37 = vfmadd132sd_fma(auVar40,auVar37,auVar2);
                        auVar3._8_8_ = 0;
                        auVar3._0_8_ = pdVar11[uVar25 + 3];
                        auVar37 = vfmadd132sd_fma(auVar33,auVar37,auVar3);
                        auVar34 = ZEXT1664(auVar37);
                        uVar25 = uVar25 + 4;
                      } while ((long)uVar25 < (long)(int)(uVar23 & 0xfffffffc));
                    }
                    auVar37 = auVar34._0_16_;
                    if ((int)uVar25 < iVar9) {
                      uVar25 = uVar25 & 0xffffffff;
                      do {
                        auVar36._8_8_ = 0;
                        auVar36._0_8_ = pdVar19[uVar25];
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = pdVar11[uVar25];
                        auVar37 = vfmadd231sd_fma(auVar34._0_16_,auVar36,auVar4);
                        auVar34 = ZEXT1664(auVar37);
                        uVar25 = uVar25 + 1;
                      } while (uVar18 != uVar25);
                    }
                    auVar37 = vmaxsd_avx(auVar37,ZEXT816(0) << 0x40);
                    pdVar19 = pdVar19 + uVar18;
                    iVar22 = iVar22 + 1;
                    pdVar10[lVar24] = auVar37._0_8_;
                    lVar29 = lVar24 + 1;
                  } while (iVar22 != iVar9);
                  iVar30 = (int)lVar24 + 2;
                  iVar26 = iVar26 + 1;
                  pdVar10[(int)(lVar24 + 1)] = 1.0;
                } while (iVar26 != iVar9);
              }
            }
            uVar25 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar20 = lVar20 + 1;
          } while (lVar20 < (long)uVar25);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != (uint)count);
    }
  }
  else if (secondDerivativeIndices == (int *)0x0) {
    if (0 < count) {
      uVar25 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
      uVar21 = 0;
      do {
        if (0 < (int)uVar25) {
          iVar30 = 0;
          pdVar10 = transitionMatrices[probabilityIndices[uVar21]];
          pdVar19 = transitionMatrices[firstDerivativeIndices[uVar21]];
          lVar20 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar29 = 0;
              do {
                dVar31 = (this->super_EigenDecomposition<double,_1>).gEigenValues
                         [eigenIndices[lVar20]][lVar29];
                dVar32 = exp(dVar31 * edgeLengths[uVar21]);
                (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar32;
                (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar29] = dVar32 * dVar31;
                lVar29 = lVar29 + 1;
                iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
                uVar18 = (ulong)iVar9;
              } while (lVar29 < (long)uVar18);
              if (0 < iVar9) {
                iVar26 = eigenIndices[lVar20];
                iVar22 = 0;
                lVar29 = 0;
                do {
                  pdVar11 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                  pdVar12 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                  iVar27 = 0;
                  pdVar13 = this->gCMatrices[iVar26];
                  lVar24 = (long)iVar30;
                  do {
                    lVar28 = lVar24;
                    auVar34 = ZEXT864(0) << 0x40;
                    auVar37 = ZEXT816(0) << 0x40;
                    uVar25 = 0;
                    do {
                      auVar41._8_8_ = 0;
                      auVar41._0_8_ = pdVar13[(long)(int)lVar29 + uVar25];
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = pdVar11[uVar25];
                      auVar37 = vfmadd231sd_fma(auVar37,auVar41,auVar16);
                      auVar17._8_8_ = 0;
                      auVar17._0_8_ = pdVar12[uVar25];
                      auVar16 = vfmadd231sd_fma(auVar34._0_16_,auVar41,auVar17);
                      auVar34 = ZEXT1664(auVar16);
                      uVar25 = uVar25 + 1;
                    } while (uVar18 != uVar25);
                    auVar37 = vmaxsd_avx(auVar37,ZEXT816(0) << 0x40);
                    lVar29 = (long)(int)lVar29 + uVar18;
                    iVar27 = iVar27 + 1;
                    pdVar10[lVar28] = auVar37._0_8_;
                    pdVar19[lVar28] = auVar16._0_8_;
                    lVar24 = lVar28 + 1;
                  } while (iVar27 != iVar9);
                  iVar27 = (int)(lVar28 + 1);
                  iVar30 = (int)lVar28 + 2;
                  iVar22 = iVar22 + 1;
                  pdVar10[iVar27] = 1.0;
                  pdVar19[iVar27] = 0.0;
                } while (iVar22 != iVar9);
              }
            }
            uVar25 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
            lVar20 = lVar20 + 1;
          } while (lVar20 < (long)uVar25);
        }
        uVar21 = uVar21 + 1;
      } while (uVar21 != (uint)count);
    }
  }
  else if (0 < count) {
    uVar25 = (ulong)(uint)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
    uVar21 = 0;
    do {
      if (0 < (int)uVar25) {
        iVar30 = 0;
        pdVar10 = transitionMatrices[probabilityIndices[uVar21]];
        pdVar19 = transitionMatrices[firstDerivativeIndices[uVar21]];
        pdVar11 = transitionMatrices[secondDerivativeIndices[uVar21]];
        lVar20 = 0;
        do {
          if (0 < (int)uVar18) {
            lVar29 = 0;
            do {
              dVar31 = (this->super_EigenDecomposition<double,_1>).gEigenValues
                       [eigenIndices[lVar20]][lVar29];
              dVar32 = exp(dVar31 * edgeLengths[uVar21]);
              (this->super_EigenDecomposition<double,_1>).matrixTmp[lVar29] = dVar32;
              (this->super_EigenDecomposition<double,_1>).firstDerivTmp[lVar29] = dVar31 * dVar32;
              (this->super_EigenDecomposition<double,_1>).secondDerivTmp[lVar29] =
                   dVar31 * dVar31 * dVar32;
              lVar29 = lVar29 + 1;
              iVar9 = (this->super_EigenDecomposition<double,_1>).kStateCount;
              uVar18 = (ulong)iVar9;
            } while (lVar29 < (long)uVar18);
            if (0 < iVar9) {
              iVar26 = eigenIndices[lVar20];
              iVar22 = 0;
              lVar29 = 0;
              do {
                pdVar12 = (this->super_EigenDecomposition<double,_1>).matrixTmp;
                pdVar13 = (this->super_EigenDecomposition<double,_1>).firstDerivTmp;
                pdVar14 = (this->super_EigenDecomposition<double,_1>).secondDerivTmp;
                iVar27 = 0;
                pdVar15 = this->gCMatrices[iVar26];
                lVar24 = (long)iVar30;
                do {
                  lVar28 = lVar24;
                  auVar34 = ZEXT864(0) << 0x40;
                  auVar38 = ZEXT864(0) << 0x40;
                  auVar37 = ZEXT816(0) << 0x40;
                  uVar25 = 0;
                  do {
                    auVar42._8_8_ = 0;
                    auVar42._0_8_ = pdVar15[(long)(int)lVar29 + uVar25];
                    auVar5._8_8_ = 0;
                    auVar5._0_8_ = pdVar12[uVar25];
                    auVar37 = vfmadd231sd_fma(auVar37,auVar42,auVar5);
                    auVar6._8_8_ = 0;
                    auVar6._0_8_ = pdVar13[uVar25];
                    auVar16 = vfmadd231sd_fma(auVar38._0_16_,auVar42,auVar6);
                    auVar38 = ZEXT1664(auVar16);
                    auVar7._8_8_ = 0;
                    auVar7._0_8_ = pdVar14[uVar25];
                    auVar17 = vfmadd231sd_fma(auVar34._0_16_,auVar42,auVar7);
                    auVar34 = ZEXT1664(auVar17);
                    uVar25 = uVar25 + 1;
                  } while (uVar18 != uVar25);
                  auVar37 = vmaxsd_avx(auVar37,ZEXT816(0) << 0x40);
                  lVar29 = (long)(int)lVar29 + uVar18;
                  iVar27 = iVar27 + 1;
                  pdVar10[lVar28] = auVar37._0_8_;
                  pdVar19[lVar28] = auVar16._0_8_;
                  pdVar11[lVar28] = auVar17._0_8_;
                  lVar24 = lVar28 + 1;
                } while (iVar27 != iVar9);
                iVar27 = (int)(lVar28 + 1);
                iVar30 = (int)lVar28 + 2;
                iVar22 = iVar22 + 1;
                pdVar10[iVar27] = 1.0;
                pdVar19[iVar27] = 0.0;
                pdVar11[iVar27] = 0.0;
              } while (iVar22 != iVar9);
            }
          }
          uVar25 = (ulong)(this->super_EigenDecomposition<double,_1>).kCategoryCount;
          lVar20 = lVar20 + 1;
        } while (lVar20 < (long)uVar25);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionCube<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                      const int* probabilityIndices,
                                                      const int* firstDerivativeIndices,
                                                      const int* secondDerivativeIndices,
                                                      const double* edgeLengths,
                                                      REALTYPE** transitionMatrices,
                                                      int count) {
#ifdef UNROLL													  
	int stateCountModFour = (kStateCount / 4) * 4;
#endif
													  
	if (firstDerivativeIndices == NULL && secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
                for (int i = 0; i < kStateCount; i++) {
					matrixTmp[i] = exp(gEigenValues[eigenIndices[l]][i] * ((REALTYPE)edgeLengths[u]));
                }
				
                REALTYPE* tmpCMatrices = gCMatrices[eigenIndices[l]];
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
#ifdef UNROLL						
						int k = 0;
						for (; k < stateCountModFour; k += 4) {
							sum += tmpCMatrices[k + 0] * matrixTmp[k + 0];
							sum += tmpCMatrices[k + 1] * matrixTmp[k + 1];
							sum += tmpCMatrices[k + 2] * matrixTmp[k + 2];
							sum += tmpCMatrices[k + 3] * matrixTmp[k + 3];
						}
						for (; k < kStateCount; k++) {
							sum += tmpCMatrices[k] * matrixTmp[k];
						}
						tmpCMatrices += kStateCount;
#else
						for (int k = 0; k < kStateCount; k++) {
							sum += *tmpCMatrices++ * matrixTmp[k];
						}
#endif						
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
					n += T_PAD;
}
				}
			}
			
			if (DEBUGGING_OUTPUT) {
                int kMatrixSize = kStateCount * kStateCount;
				fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
				for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
					fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
			}
		}
        

	} else if (secondDerivativeIndices == NULL) {
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	} else {		
		for (int u = 0; u < count; u++) {
			REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
			REALTYPE* firstDerivMat = transitionMatrices[firstDerivativeIndices[u]];
			REALTYPE* secondDerivMat = transitionMatrices[secondDerivativeIndices[u]];
			int n = 0;
			for (int l = 0; l < kCategoryCount; l++) {
				
				for (int i = 0; i < kStateCount; i++) {
					REALTYPE scaledEigenValue = gEigenValues[eigenIndices[l]][i];
					matrixTmp[i] = exp(scaledEigenValue * ((REALTYPE)edgeLengths[u]));
					firstDerivTmp[i] = scaledEigenValue * matrixTmp[i];
					secondDerivTmp[i] = scaledEigenValue * firstDerivTmp[i];
				}
				
				int m = 0;
				for (int i = 0; i < kStateCount; i++) {
					for (int j = 0; j < kStateCount; j++) {
						REALTYPE sum = 0.0;
						REALTYPE sumD1 = 0.0;
						REALTYPE sumD2 = 0.0;
						for (int k = 0; k < kStateCount; k++) {
							sum += gCMatrices[eigenIndices[l]][m] * matrixTmp[k];
							sumD1 += gCMatrices[eigenIndices[l]][m] * firstDerivTmp[k];
							sumD2 += gCMatrices[eigenIndices[l]][m] * secondDerivTmp[k];
							m++;
						}
						if (sum > 0)
							transitionMat[n] = sum;
						else
							transitionMat[n] = 0;
						firstDerivMat[n] = sumD1;
						secondDerivMat[n] = sumD2;
						n++;
					}
if (T_PAD != 0) {
					transitionMat[n] = 1.0;
                    firstDerivMat[n] = 0.0;
                    secondDerivMat[n] = 0.0;
					n += T_PAD;
}
				}
			}
		}
	}
}